

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputmethod.cpp
# Opt level: O0

void __thiscall QInputMethod::setInputItemTransform(QInputMethod *this,QTransform *transform)

{
  bool bVar1;
  QInputMethodPrivate *pQVar2;
  QTransform *in_RSI;
  QInputMethodPrivate *d;
  
  pQVar2 = d_func((QInputMethod *)0x3a3421);
  bVar1 = QTransform::operator==(&pQVar2->inputItemTransform,in_RSI);
  if (!bVar1) {
    memcpy(&pQVar2->inputItemTransform,in_RSI,0x4a);
    cursorRectangleChanged((QInputMethod *)0x3a3463);
    anchorRectangleChanged((QInputMethod *)0x3a346d);
  }
  return;
}

Assistant:

void QInputMethod::setInputItemTransform(const QTransform &transform)
{
    Q_D(QInputMethod);
    if (d->inputItemTransform == transform)
        return;

    d->inputItemTransform = transform;
    emit cursorRectangleChanged();
    emit anchorRectangleChanged();
}